

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>,_ProString_&>,_ProString>
                  *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->b);
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[11]>,_ProString> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;